

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.cpp
# Opt level: O2

void __thiscall
TPZDohrMatrix<float,_TPZDohrSubstructCondense<float>_>::Write
          (TPZDohrMatrix<float,_TPZDohrSubstructCondense<float>_> *this,TPZStream *buf,
          int withclassid)

{
  _List_node_base *p_Var1;
  int size;
  int classid;
  
  TPZBaseMatrix::Write((TPZBaseMatrix *)this,buf,withclassid);
  TPZPersistenceManager::WritePointer(&((this->fAssembly).fRef)->fPointer->super_TPZSavable,buf);
  (*buf->_vptr_TPZStream[3])(buf,&this->fNumCoarse,1);
  (*buf->_vptr_TPZStream[3])(buf,&this->fNumThreads,1);
  size = (int)(this->fGlobal).
              super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
              ._M_impl._M_node._M_size;
  (*buf->_vptr_TPZStream[3])(buf,&size,1);
  p_Var1 = (_List_node_base *)&this->fGlobal;
  while (p_Var1 = (((_List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->fGlobal) {
    (**(code **)(**(long **)p_Var1[1]._M_next + 0x28))(*(long **)p_Var1[1]._M_next,buf,0);
  }
  size = 0;
  classid = (*(this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [4])(this);
  (*buf->_vptr_TPZStream[3])(buf,&classid,1);
  return;
}

Assistant:

void TPZDohrMatrix<TVar,TSubStruct >::Write( TPZStream &buf, int withclassid ) const
{
    SAVEABLE_STR_NOTE(buf,"TPZMatrix<TVar>::Write ()");
    TPZMatrix<TVar>::Write(buf, withclassid);
    SAVEABLE_STR_NOTE(buf,"fAssembly->Write");
    TPZPersistenceManager::WritePointer(fAssembly.operator ->(), &buf);
    SAVEABLE_STR_NOTE(buf,"fNumCoarse");
    buf.Write(&fNumCoarse);
    SAVEABLE_STR_NOTE(buf,"fNumThreads");
    buf.Write(&fNumThreads);
    int size = fGlobal.size();
    SAVEABLE_STR_NOTE(buf,"fGlobal.size()");
    buf.Write(&size);
    for (auto it=fGlobal.begin(); it != fGlobal.end(); it++) {
        SAVEABLE_STR_NOTE(buf,"fGlobal[...]");
        (*it)->Write(buf,0);
    }
    size = 0;
    int classid = ClassId();
    SAVEABLE_STR_NOTE(buf,"ClassId");
    buf.Write(&classid );
}